

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  Variant *pVVar1;
  SPIRVariable *pSVar2;
  SPIRExtension *pSVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  uVar5 = 0;
  uVar6 = uVar5;
  if (0xa8 < (int)opcode) {
    uVar6 = 0;
    switch(opcode) {
    case OpAtomicLoad:
    case OpAtomicExchange:
    case OpAtomicCompareExchange:
    case OpAtomicCompareExchangeWeak:
    case OpAtomicIIncrement:
    case OpAtomicIDecrement:
    case OpAtomicIAdd:
    case OpAtomicISub:
    case OpAtomicSMin:
    case OpAtomicUMin:
    case OpAtomicSMax:
    case OpAtomicUMax:
    case OpAtomicAnd:
    case OpAtomicOr:
    case OpAtomicXor:
      goto switchD_002bad94_caseD_e3;
    case OpAtomicStore:
      goto switchD_002bad94_caseD_e4;
    case OpAtomicXor|OpUndef:
    case OpAtomicAnd|OpSourceExtension:
      break;
    case OpPhi:
      if (length < 2) {
        return false;
      }
      uVar6 = 0;
      if (length - 2 != 0) {
        uVar7 = 0;
        do {
          uVar4 = (ulong)args[uVar7 + 2];
          if ((uVar4 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size)
             && (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
                pVVar1[uVar4].type == TypeVariable)) {
            pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar4);
          }
          else {
            pSVar2 = (SPIRVariable *)0x0;
          }
          if (((pSVar2 != (SPIRVariable *)0x0) &&
              (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
             ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
            local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)this->variables;
            local_3c = args[uVar7 + 2];
            ::std::
            _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                      (local_38,&local_3c,&local_38);
          }
          uVar7 = uVar7 + 2;
          uVar6 = 0;
        } while (uVar7 < length - 2);
      }
      break;
    default:
      uVar6 = uVar5;
      if (opcode == OpSelect) {
        if (length < 5) {
          return false;
        }
        uVar6 = 0;
        if (length - 3 != 0) {
          uVar7 = 0;
          do {
            uVar4 = (ulong)args[uVar7 + 3];
            if ((uVar4 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size
                ) && (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
                     pVVar1[uVar4].type == TypeVariable)) {
              pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar4);
            }
            else {
              pSVar2 = (SPIRVariable *)0x0;
            }
            if (((pSVar2 != (SPIRVariable *)0x0) &&
                (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
               ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar7 + 3];
              ::std::
              _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
            uVar7 = uVar7 + 1;
            uVar6 = 0;
          } while (length - 3 != uVar7);
        }
      }
    }
    goto switchD_002bad94_caseD_f3;
  }
  switch(opcode) {
  case OpFunctionCall:
    if (length < 3) {
      return false;
    }
    uVar6 = 0;
    if (length - 3 != 0) {
      uVar7 = 0;
      do {
        uVar4 = (ulong)args[uVar7 + 3];
        if ((uVar4 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
           pVVar1[uVar4].type == TypeVariable)) {
          pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar4);
        }
        else {
          pSVar2 = (SPIRVariable *)0x0;
        }
        if (((pSVar2 != (SPIRVariable *)0x0) &&
            (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
           ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
          local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)this->variables;
          local_3c = args[uVar7 + 3];
          ::std::
          _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                    (local_38,&local_3c,&local_38);
        }
        uVar7 = uVar7 + 1;
        uVar6 = 0;
      } while (length - 3 != uVar7);
    }
    break;
  case OpFunctionEnd|OpSourceContinued:
  case OpVariable:
  case OpCopyMemorySized:
    break;
  case OpStore:
switchD_002bad94_caseD_e4:
    if (length == 0) {
      return false;
    }
    uVar6 = *args;
    break;
  case OpCopyMemory:
    if (length < 2) {
      return false;
    }
    uVar7 = (ulong)*args;
    if ((uVar7 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar7].type == TypeVariable)) {
      pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar7);
    }
    else {
      pSVar2 = (SPIRVariable *)0x0;
    }
    if (((pSVar2 != (SPIRVariable *)0x0) &&
        (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
       ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
      local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this->variables;
      local_3c = *args;
      ::std::
      _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                ();
    }
    uVar7 = (ulong)args[1];
    uVar6 = 0;
    if ((uVar7 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar7].type == TypeVariable)) {
      pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar7);
    }
    else {
      pSVar2 = (SPIRVariable *)0x0;
    }
    if (((pSVar2 == (SPIRVariable *)0x0) || (StorageClassStorageBuffer < pSVar2->storage)) ||
       ((0x160fU >> (pSVar2->storage & 0x1f) & 1) == 0)) break;
    local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this->variables;
    local_3c = args[1];
LAB_002bb159:
    ::std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
              ();
    uVar6 = 0;
    break;
  default:
    if (opcode == OpExtInst) {
      if (length < 5) {
        return false;
      }
      pSVar3 = Variant::get<spirv_cross::SPIRExtension>
                         ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          args[2]);
      uVar6 = 0;
      if ((*(int *)&(pSVar3->super_IVariant).field_0xc != 4) || (args[3] != 1)) break;
      uVar7 = (ulong)args[4];
      uVar6 = 0;
      if ((uVar7 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar1[uVar7].type == TypeVariable)) {
        pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar7);
      }
      else {
        pSVar2 = (SPIRVariable *)0x0;
      }
      if (((pSVar2 == (SPIRVariable *)0x0) || (StorageClassStorageBuffer < pSVar2->storage)) ||
         ((0x160fU >> (pSVar2->storage & 0x1f) & 1) == 0)) break;
      local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this->variables;
      local_3c = args[4];
      goto LAB_002bb159;
    }
    if (opcode != OpCopyObject) break;
  case OpImageTexelPointer:
  case OpLoad:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
switchD_002bad94_caseD_e3:
    if (length < 3) {
      return false;
    }
    uVar6 = args[2];
  }
switchD_002bad94_caseD_f3:
  if (uVar6 != 0) {
    uVar7 = (ulong)uVar6;
    if ((uVar7 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar7].type == TypeVariable)) {
      pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar7);
    }
    else {
      pSVar2 = (SPIRVariable *)0x0;
    }
    if (((pSVar2 != (SPIRVariable *)0x0) &&
        (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
       ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
      local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this->variables;
      local_3c = uVar6;
      ::std::
      _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                ();
    }
  }
  return true;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 5)
			return false;
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter)
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}